

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_25d63::QSBR_SingleThreadAllocationAndEpochChange_Test::
QSBR_SingleThreadAllocationAndEpochChange_Test(QSBR_SingleThreadAllocationAndEpochChange_Test *this)

{
  QSBR_SingleThreadAllocationAndEpochChange_Test *this_local;
  
  unodb::test::QSBRTestBase::QSBRTestBase(&this->super_QSBR);
  (this->super_QSBR).super_Test._vptr_Test =
       (_func_int **)&PTR__QSBR_SingleThreadAllocationAndEpochChange_Test_001f81d8;
  return;
}

Assistant:

UNODB_TEST_F(QSBR, SingleThreadAllocationAndEpochChange) {
  auto *ptr = static_cast<char *>(allocate());
  touch_memory(ptr);
  qsbr_deallocate(ptr);

  mark_epoch();

  quiescent();

  check_epoch_advanced();

  ptr = static_cast<char *>(allocate());
  touch_memory(ptr);
  qsbr_deallocate(ptr);
}